

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O0

MPP_RET mpp_node_attach(MppNode node,MppClientType type)

{
  RK_S32 *pRVar1;
  RK_S32 RVar2;
  uint uVar3;
  MppClusterServer *this;
  MppCluster *pMVar4;
  ClusterQueue *queue;
  RK_U32 priority;
  MppCluster *p;
  MppNodeImpl *impl;
  MppClientType type_local;
  MppNode node_local;
  
  this = MppClusterServer::single();
  pMVar4 = MppClusterServer::get(this,type);
  uVar3 = *(uint *)((long)node + 0x48);
  if ((uVar3 != 0) &&
     (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"priority < 1",
                 "mpp_node_attach",0x2c5), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((pMVar4 == (MppCluster *)0x0) &&
     (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"p","mpp_node_attach",
                 0x2c6), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  LOCK();
  pRVar1 = &pMVar4->node_id;
  RVar2 = *pRVar1;
  *pRVar1 = *pRVar1 + 1;
  UNLOCK();
  *(RK_S32 *)((long)node + 0x20) = RVar2;
  snprintf((char *)node,0x1f,"%s:%d",pMVar4,(ulong)*(uint *)((long)node + 0x20));
  mpp_node_task_attach
            ((MppNodeTask *)((long)node + 0x70),(MppNodeImpl *)node,pMVar4->queue + uVar3,
             (MppNodeProc *)((long)node + 0x28));
  LOCK();
  pMVar4->node_count = pMVar4->node_count + 1;
  UNLOCK();
  if ((mpp_cluster_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_cluster","%s:%d attached %d\n",(char *)0x0,pMVar4,
               (ulong)*(uint *)((long)node + 0x20),pMVar4->node_count);
  }
  mpp_node_task_schedule_f("mpp_node_attach",(MppNodeTask *)((long)node + 0x70));
  if ((mpp_cluster_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_cluster","%s trigger signal from %s\n",(char *)0x0,node,"mpp_node_attach");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_node_attach(MppNode node, MppClientType type)
{
    MppNodeImpl *impl = (MppNodeImpl *)node;
    MppCluster *p = MppClusterServer::single()->get(type);
    RK_U32 priority = impl->priority;
    ClusterQueue *queue = &p->queue[priority];

    mpp_assert(priority < MAX_PRIORITY);
    mpp_assert(p);

    impl->node_id = MPP_FETCH_ADD(&p->node_id, 1);

    snprintf(impl->name, sizeof(impl->name) - 1, "%s:%d", p->name, impl->node_id);

    mpp_node_task_attach(&impl->task, impl, queue, &impl->work);

    MPP_FETCH_ADD(&p->node_count, 1);

    cluster_dbg_flow("%s:%d attached %d\n", p->name, impl->node_id, p->node_count);

    /* attach and run once first */
    mpp_node_task_schedule(&impl->task);
    cluster_dbg_flow("%s trigger signal from %s\n", impl->name, __FUNCTION__);

    return MPP_OK;
}